

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsdl-parser.cpp
# Opt level: O0

TsdlAttr * __thiscall
yactfr::internal::TsdlParser::_expectAttr(TsdlAttr *__return_storage_ptr__,TsdlParser *this)

{
  TextLocation loc;
  bool bVar1;
  reference_type pTVar2;
  string *psVar3;
  reference_const_type puVar4;
  reference_const_type plVar5;
  optional<unsigned_long_long> oVar6;
  optional<long_long> oVar7;
  allocator local_161;
  string local_160;
  undefined1 local_140 [8];
  optional<long_long> val_1;
  optional<unsigned_long_long> val;
  string *ident_2;
  string *escapedStr;
  TextLocation local_108;
  allocator local_e9;
  string local_e8;
  string *local_c8;
  string *ident_1;
  Index local_a8;
  Index IStack_a0;
  Index local_98;
  allocator local_81;
  string local_80;
  string *local_60;
  string *ident;
  byte local_2a;
  undefined1 local_29;
  bool nameIsFound;
  TsdlParser *pTStack_28;
  TsdlParser *this_local;
  TsdlAttr *attr;
  optional<long_long> *local_10;
  
  local_29 = 0;
  pTStack_28 = this;
  this_local = (TsdlParser *)__return_storage_ptr__;
  TsdlAttr::TsdlAttr(__return_storage_ptr__);
  local_2a = 0;
  StrScanner::skipCommentsAndWhitespaces<true,true>(&this->_ss);
  StrScanner::loc((TextLocation *)&ident,&this->_ss);
  boost::optional<yactfr::TextLocation>::operator=
            (&__return_storage_ptr__->nameLoc,(TextLocation *)&ident);
  bVar1 = StrScanner::tryScanToken(&this->_ss,"model.emf.uri");
  if (bVar1) {
    local_2a = 1;
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->name,"model.emf.uri");
  }
  else {
    local_60 = StrScanner::tryScanIdent_abi_cxx11_(&this->_ss);
    if (local_60 != (string *)0x0) {
      local_2a = 1;
      std::__cxx11::string::operator=((string *)&__return_storage_ptr__->name,(string *)local_60);
    }
  }
  if ((local_2a & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_80,"Expecting attribute name.",&local_81);
    pTVar2 = boost::optional<yactfr::TextLocation>::operator*(&__return_storage_ptr__->nameLoc);
    local_98 = pTVar2->_colNumber;
    local_a8 = pTVar2->_offset;
    IStack_a0 = pTVar2->_lineNumber;
    throwTextParseError(&local_80,*pTVar2);
  }
  _expectToken(this,"=");
  StrScanner::skipCommentsAndWhitespaces<true,true>(&this->_ss);
  StrScanner::loc((TextLocation *)&ident_1,&this->_ss);
  boost::optional<yactfr::TextLocation>::operator=
            (&__return_storage_ptr__->valLoc,(TextLocation *)&ident_1);
  bVar1 = std::operator==(&__return_storage_ptr__->name,"map");
  if (bVar1) {
    __return_storage_ptr__->kind = ClkNameValue;
    _expectToken(this,"clock");
    _expectToken(this,".");
    local_c8 = StrScanner::tryScanIdent_abi_cxx11_(&this->_ss);
    if (local_c8 == (string *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_e8,"Expecting identifier (clock type internal ID).",&local_e9);
      StrScanner::loc(&local_108,&this->_ss);
      loc._lineNumber = local_108._lineNumber;
      loc._offset = local_108._offset;
      loc._colNumber = local_108._colNumber;
      throwTextParseError(&local_e8,loc);
    }
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->strVal,(string *)local_c8);
    _expectToken(this,".");
    _expectToken(this,"value");
    _expectToken(this,";");
  }
  else {
    psVar3 = _tryScanLitStr_abi_cxx11_(this);
    if (psVar3 == (string *)0x0) {
      psVar3 = StrScanner::tryScanIdent_abi_cxx11_(&this->_ss);
      if (psVar3 == (string *)0x0) {
        oVar6 = StrScanner::tryScanConstUInt<true>(&this->_ss);
        val_1.super_type.m_storage._0_1_ = oVar6.super_type.m_initialized;
        attr = (TsdlAttr *)&val_1.super_type.m_storage;
        bVar1 = boost::optional<unsigned_long_long>::operator!((optional<unsigned_long_long> *)attr)
        ;
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          oVar7 = StrScanner::tryScanConstSInt<true>(&this->_ss);
          val_1.super_type._0_8_ = oVar7.super_type.m_storage;
          local_140[0] = oVar7.super_type.m_initialized;
          local_10 = (optional<long_long> *)local_140;
          bVar1 = boost::optional<long_long>::operator!(local_10);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_160,
                       "Expecting valid constant integer, literal string, or identifier.",&local_161
                      );
            pTVar2 = boost::optional<yactfr::TextLocation>::operator*
                               (&__return_storage_ptr__->valLoc);
            throwTextParseError(&local_160,*pTVar2);
          }
          plVar5 = boost::optional<long_long>::operator*((optional<long_long> *)local_140);
          __return_storage_ptr__->intVal = *plVar5;
          __return_storage_ptr__->kind = SInt;
          bVar1 = false;
          if (__return_storage_ptr__->intVal != 0) {
            bVar1 = __return_storage_ptr__->intVal != 1;
          }
          if (!bVar1) {
            __assert_fail("attr.intVal != 0 && attr.intVal != 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/eepp[P]yactfr/yactfr/internal/metadata/tsdl/tsdl-parser.cpp"
                          ,0xa69,"TsdlAttr yactfr::internal::TsdlParser::_expectAttr()");
          }
        }
        else {
          puVar4 = boost::optional<unsigned_long_long>::operator*
                             ((optional<unsigned_long_long> *)&val_1.super_type.m_storage);
          __return_storage_ptr__->uintVal = *puVar4;
          __return_storage_ptr__->kind = UInt;
        }
      }
      else {
        std::__cxx11::string::operator=((string *)&__return_storage_ptr__->strVal,(string *)psVar3);
        __return_storage_ptr__->kind = Ident;
      }
    }
    else {
      std::__cxx11::string::operator=((string *)&__return_storage_ptr__->strVal,(string *)psVar3);
      __return_storage_ptr__->kind = Str;
    }
    _expectToken(this,";");
  }
  return __return_storage_ptr__;
}

Assistant:

TsdlAttr TsdlParser::_expectAttr()
{
    TsdlAttr attr;

    // parse name
    {
        auto nameIsFound = false;

        _ss.skipCommentsAndWhitespaces();
        attr.nameLoc = _ss.loc();

        if (_ss.tryScanToken("model.emf.uri")) {
            nameIsFound = true;
            attr.name = "model.emf.uri";
        } else if (const auto ident = _ss.tryScanIdent()) {
            nameIsFound = true;
            attr.name = *ident;
        }

        if (!nameIsFound) {
            throwTextParseError("Expecting attribute name.", *attr.nameLoc);
        }
    }

    // parse `=`
    this->_expectToken("=");

    // this it the source location of the attribute for an eventual error
    _ss.skipCommentsAndWhitespaces();
    attr.valLoc = _ss.loc();

    // special case for the `map` attribute
    if (attr.name == "map") {
        attr.kind = TsdlAttr::Kind::ClkNameValue;

        // parse `clock`
        this->_expectToken("clock");

        // parse `.`
        this->_expectToken(".");

        // parse internal ID (name) of clock type
        if (const auto ident = _ss.tryScanIdent()) {
            attr.strVal = *ident;
        } else {
            throwTextParseError("Expecting identifier (clock type internal ID).", _ss.loc());
        }

        // parse `.`
        this->_expectToken(".");

        // parse `value`
        this->_expectToken("value");

        // parse `;`
        this->_expectToken(";");
        return attr;
    }

    if (const auto escapedStr = this->_tryScanLitStr()) {
        // literal string
        attr.strVal = *escapedStr;
        attr.kind = TsdlAttr::Kind::Str;
    } else if (const auto ident = _ss.tryScanIdent()) {
        // identifier
        attr.strVal = *ident;
        attr.kind = TsdlAttr::Kind::Ident;
    } else if (const auto val = _ss.tryScanConstUInt()) {
        // constant unsigned integer
        attr.uintVal = *val;
        attr.kind = TsdlAttr::Kind::UInt;
    } else if (const auto val = _ss.tryScanConstSInt()) {
        // constant signed integer
        attr.intVal = *val;
        attr.kind = TsdlAttr::Kind::SInt;
        assert(attr.intVal != 0 && attr.intVal != 1);
    } else {
        throwTextParseError("Expecting valid constant integer, literal string, or identifier.",
                            *attr.valLoc);
    }

    // parse `;`
    this->_expectToken(";");
    return attr;
}